

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O2

void TransposeTest(void)

{
  long lVar1;
  abctime aVar2;
  abctime aVar3;
  abctime time;
  abctime time_00;
  int iVar4;
  word *in_RSI;
  long lVar5;
  bool bVar6;
  word M [64];
  word N [64];
  
  Aig_ManRandom64(1);
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    M[lVar1] = -(ulong)(lVar1 == 0);
  }
  iVar4 = 0x186a1;
  aVar2 = Abc_Clock();
  while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
    in_RSI = N;
    transpose64Simple(M,N);
  }
  aVar3 = Abc_Clock();
  Abc_PrintTime((int)aVar3 - (int)aVar2,(char *)in_RSI,time);
  iVar4 = 0x186a1;
  aVar2 = Abc_Clock();
  while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
    transpose64(M);
  }
  aVar3 = Abc_Clock();
  lVar1 = aVar3 - aVar2;
  Abc_PrintTime((int)lVar1,(char *)in_RSI,time_00);
  for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 1) {
    if (M[lVar5] != N[lVar5]) {
      Abc_Print((int)lVar1,"Mismatch\n");
    }
  }
  return;
}

Assistant:

void TransposeTest()
{
    word M[64], N[64];
    int i;
    abctime clk;
    Aig_ManRandom64( 1 );
//    for ( i = 0; i < 64; i++ )
//        M[i] = Aig_ManRandom64( 0 );
    for ( i = 0; i < 64; i++ )
        M[i] = i? (word)0 : ~(word)0;
//    for ( i = 0; i < 64; i++ )
//        Extra_PrintBinary( stdout, (unsigned *)&M[i], 64 ), Abc_Print( 1, "\n" );

    clk = Abc_Clock();
    for ( i = 0; i < 100001; i++ )
        transpose64Simple( M, N );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    clk = Abc_Clock();
    for ( i = 0; i < 100001; i++ )
        transpose64( M );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    for ( i = 0; i < 64; i++ )
        if ( M[i] != N[i] )
            Abc_Print( 1, "Mismatch\n" );
/*
    Abc_Print( 1, "\n" );
    for ( i = 0; i < 64; i++ )
        Extra_PrintBinary( stdout, (unsigned *)&M[i], 64 ), Abc_Print( 1, "\n" );
    Abc_Print( 1, "\n" );
    for ( i = 0; i < 64; i++ )
        Extra_PrintBinary( stdout, (unsigned *)&N[i], 64 ), Abc_Print( 1, "\n" );
*/
}